

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLock::ConstraintsBiReset(ChLinkLock *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  ChLinkLimit *pCVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)(this->mask).super_ChLinkMask.nconstr;
  if (0 < lVar4) {
    ppCVar2 = (this->mask).super_ChLinkMask.constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      if ((this->mask).super_ChLinkMask.nconstr <= lVar5) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      ppCVar1 = ppCVar2 + lVar5;
      lVar5 = lVar5 + 1;
      ((*ppCVar1)->super_ChConstraintTwo).super_ChConstraint.b_i = 0.0;
    } while (lVar4 != lVar5);
  }
  pCVar3 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if (*(bool *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar3 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if (*(bool *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar3 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if (*(bool *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar3 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if (*(bool *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar3 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if (*(bool *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar3 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if (*(bool *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar3->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  return;
}

Assistant:

void ChLinkLock::ConstraintsBiReset() {
    for (int i = 0; i < mask.nconstr; i++) {
        mask.Constr_N(i).Set_b_i(0.);
    }

    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            limit_X->constr_lower.Set_b_i(0.);
        }
        if (limit_X->constr_upper.IsActive()) {
            limit_X->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            limit_Y->constr_lower.Set_b_i(0.);
        }
        if (limit_Y->constr_upper.IsActive()) {
            limit_Y->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            limit_Z->constr_lower.Set_b_i(0.);
        }
        if (limit_Z->constr_upper.IsActive()) {
            limit_Z->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            limit_Rx->constr_lower.Set_b_i(0.);
        }
        if (limit_Rx->constr_upper.IsActive()) {
            limit_Rx->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            limit_Ry->constr_lower.Set_b_i(0.);
        }
        if (limit_Ry->constr_upper.IsActive()) {
            limit_Ry->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            limit_Rz->constr_lower.Set_b_i(0.);
        }
        if (limit_Rz->constr_upper.IsActive()) {
            limit_Rz->constr_upper.Set_b_i(0.);
        }
    }
}